

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

int SoapySDRDevice_setMasterClockRate(SoapySDRDevice *device,double rate)

{
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  exception *ex;
  
  SoapySDRDevice_clearError();
  (**(code **)(*in_RDI + 0x238))(in_XMM0_Qa);
  return 0;
}

Assistant:

int SoapySDRDevice_setMasterClockRate(SoapySDRDevice *device, const double rate)
{
    __SOAPY_SDR_C_TRY
    device->setMasterClockRate(rate);
    __SOAPY_SDR_C_CATCH
}